

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# area_light.h
# Opt level: O2

void __thiscall
CS248::DynamicScene::AreaLight::AreaLight
          (AreaLight *this,LightInfo *light_info,Matrix4x4 *transform)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  float fVar6;
  Vector3D dim_x;
  Vector4D local_a8;
  double local_88;
  double dStack_80;
  double local_78;
  Vector4D local_68;
  double local_48;
  double dStack_40;
  double local_38;
  
  (this->super_SceneLight)._vptr_SceneLight = (_func_int **)&PTR_get_static_light_00275368;
  (this->spectrum).r = 0.0;
  (this->spectrum).g = 0.0;
  (this->spectrum).b = 0.0;
  (this->position).x = 0.0;
  (this->position).y = 0.0;
  (this->position).z = 0.0;
  (this->direction).x = 0.0;
  (this->direction).y = 0.0;
  (this->direction).z = 0.0;
  (this->dim_x).x = 0.0;
  (this->dim_x).y = 0.0;
  (this->dim_x).z = 0.0;
  (this->dim_y).x = 0.0;
  (this->dim_y).y = 0.0;
  (this->dim_y).z = 0.0;
  (this->spectrum).b = (light_info->spectrum).b;
  fVar6 = (light_info->spectrum).g;
  (this->spectrum).r = (light_info->spectrum).r;
  (this->spectrum).g = fVar6;
  local_a8.x = (light_info->position).x;
  local_a8.y = (light_info->position).y;
  local_a8.z = (light_info->position).z;
  local_a8.w = 1.0;
  Matrix4x4::operator*(transform,&local_a8);
  Vector4D::to3D(&local_68);
  (this->position).z = local_78;
  (this->position).x = local_88;
  (this->position).y = dStack_80;
  local_a8.x = (light_info->direction).x;
  local_a8.y = (light_info->direction).y;
  local_a8.z = (light_info->direction).z;
  local_a8.w = 1.0;
  Matrix4x4::operator*(transform,&local_a8);
  Vector4D::to3D(&local_68);
  dVar1 = (this->position).z;
  dVar2 = (this->position).y;
  (this->direction).x = local_88 - (this->position).x;
  (this->direction).y = dStack_80 - dVar2;
  (this->direction).z = local_78 - dVar1;
  Vector3D::normalize(&this->direction);
  dVar1 = (light_info->up).z;
  dVar4 = (light_info->up).x;
  dVar5 = (light_info->up).y;
  cross(&light_info->up,&light_info->direction);
  local_a8.x = local_88;
  local_a8.y = dStack_80;
  local_a8.z = local_78;
  local_a8.w = 1.0;
  Matrix4x4::operator*(transform,&local_a8);
  Vector4D::to3D(&local_68);
  dVar2 = (this->position).z;
  dVar3 = (this->position).y;
  (this->dim_x).x = local_48 - (this->position).x;
  (this->dim_x).y = dStack_40 - dVar3;
  (this->dim_x).z = local_38 - dVar2;
  local_a8.w = 1.0;
  local_a8.x = dVar4;
  local_a8.y = dVar5;
  local_a8.z = dVar1;
  Matrix4x4::operator*(transform,&local_a8);
  Vector4D::to3D(&local_68);
  dVar1 = (this->position).z;
  dVar2 = (this->position).y;
  (this->dim_y).x = local_48 - (this->position).x;
  (this->dim_y).y = dStack_40 - dVar2;
  (this->dim_y).z = local_38 - dVar1;
  return;
}

Assistant:

AreaLight(const Collada::LightInfo& light_info, const Matrix4x4& transform) {
    this->spectrum = light_info.spectrum;
    this->position = (transform * Vector4D(light_info.position, 1)).to3D();
    this->direction =
        (transform * Vector4D(light_info.direction, 1)).to3D() - position;
    this->direction.normalize();

    Vector3D dim_y = light_info.up;
    Vector3D dim_x = cross(light_info.up, light_info.direction);

    this->dim_x = (transform * Vector4D(dim_x, 1)).to3D() - position;
    this->dim_y = (transform * Vector4D(dim_y, 1)).to3D() - position;
  }